

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O0

YV12_BUFFER_CONFIG *
av1_tf_info_get_filtered_buf(TEMPORAL_FILTER_INFO *tf_info,int gf_index,FRAME_DIFF *frame_diff)

{
  int i;
  YV12_BUFFER_CONFIG *out_buf;
  FRAME_DIFF *frame_diff_local;
  int gf_index_local;
  TEMPORAL_FILTER_INFO *tf_info_local;
  YV12_BUFFER_CONFIG *local_8;
  
  if (tf_info->is_temporal_filter_on == 0) {
    local_8 = (YV12_BUFFER_CONFIG *)0x0;
  }
  else {
    out_buf = (YV12_BUFFER_CONFIG *)0x0;
    for (i = 0; i < 2; i = i + 1) {
      if ((tf_info->tf_buf_valid[i] != 0) && (tf_info->tf_buf_gf_index[i] == gf_index)) {
        out_buf = tf_info->tf_buf + i;
        frame_diff->sum = tf_info->frame_diff[i].sum;
        frame_diff->sse = tf_info->frame_diff[i].sse;
      }
    }
    local_8 = out_buf;
  }
  return local_8;
}

Assistant:

YV12_BUFFER_CONFIG *av1_tf_info_get_filtered_buf(TEMPORAL_FILTER_INFO *tf_info,
                                                 int gf_index,
                                                 FRAME_DIFF *frame_diff) {
  if (tf_info->is_temporal_filter_on == 0) return NULL;
  YV12_BUFFER_CONFIG *out_buf = NULL;
  for (int i = 0; i < TF_INFO_BUF_COUNT; ++i) {
    if (tf_info->tf_buf_valid[i] && tf_info->tf_buf_gf_index[i] == gf_index) {
      out_buf = &tf_info->tf_buf[i];
      *frame_diff = tf_info->frame_diff[i];
    }
  }
  return out_buf;
}